

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O0

b_tree_node * __thiscall
b_tree::_copy_arm(b_tree_node *__return_storage_ptr__,b_tree *this,int64_t key,int64_t node_ofs)

{
  int iVar1;
  bool bVar2;
  uint16_t uVar3;
  int64_t iVar4;
  size_t __n;
  pair<unsigned_char_*,_unsigned_char_*> pVar5;
  pair<unsigned_char_*,_unsigned_char_*> pVar6;
  undefined1 local_138 [8];
  b_tree_node child_node;
  int i;
  undefined1 local_90 [8];
  b_tree_node current_node;
  int64_t node_ofs_local;
  int64_t key_local;
  b_tree *this_local;
  b_tree_node *new_node;
  
  current_node._child_ofs_field = (int64_t *)node_ofs;
  b_tree_node::b_tree_node((b_tree_node *)local_90,&this->_p,node_ofs);
  uVar3 = b_tree_node::_min_degree((b_tree_node *)local_90);
  bVar2 = b_tree_node::_leaf((b_tree_node *)local_90);
  b_tree_node::b_tree_node(__return_storage_ptr__,&this->_p,uVar3,bVar2);
  iVar4 = b_tree_node::_ofs(__return_storage_ptr__);
  printf("%ld ",iVar4);
  pVar5 = r_memory_map::map(&__return_storage_ptr__->_mm);
  pVar6 = r_memory_map::map((r_memory_map *)&current_node._ofs_field);
  __n = pager::block_size();
  memcpy(pVar5.first,pVar6.first,__n);
  child_node._child_ofs_field._4_4_ = 0;
  while( true ) {
    iVar1 = child_node._child_ofs_field._4_4_;
    uVar3 = b_tree_node::_num_keys((b_tree_node *)local_90);
    bVar2 = false;
    if (iVar1 < (int)(uint)uVar3) {
      iVar4 = b_tree_node::_key((b_tree_node *)local_90,child_node._child_ofs_field._4_2_);
      bVar2 = iVar4 < key;
    }
    if (!bVar2) break;
    child_node._child_ofs_field._4_4_ = child_node._child_ofs_field._4_4_ + 1;
  }
  bVar2 = b_tree_node::_leaf((b_tree_node *)local_90);
  if (bVar2) {
    child_node._child_ofs_field._0_4_ = 1;
  }
  else {
    iVar4 = b_tree_node::_child_ofs((b_tree_node *)local_90,child_node._child_ofs_field._4_2_);
    _copy_arm((b_tree_node *)local_138,this,key,iVar4);
    uVar3 = child_node._child_ofs_field._4_2_;
    iVar4 = b_tree_node::_ofs((b_tree_node *)local_138);
    b_tree_node::_set_child_ofs(__return_storage_ptr__,uVar3,iVar4);
    child_node._child_ofs_field._0_4_ = 1;
    b_tree_node::~b_tree_node((b_tree_node *)local_138);
  }
  b_tree_node::~b_tree_node((b_tree_node *)local_90);
  return __return_storage_ptr__;
}

Assistant:

b_tree_node b_tree::_copy_arm(int64_t key, int64_t node_ofs)
{
    b_tree_node current_node(_p, node_ofs);
    b_tree_node new_node(_p, current_node._min_degree(), current_node._leaf());

    printf("%ld ", new_node._ofs());

    // Copy keys, values, and valid flags from the current node to the new node
    memcpy(new_node._mm.map().first, current_node._mm.map().first, _p.block_size());

    int i = 0;
    while (i < current_node._num_keys() && key > current_node._key(i))
        i++;

    // If the current node is a leaf, return the new node
    if (current_node._leaf())
        return new_node;

    // If the current node is an internal node, recursively copy the child arm
    b_tree_node child_node = _copy_arm(key, current_node._child_ofs(i));

    // Update the child offset in the new node to point to the copied child arm
    new_node._set_child_ofs(i, child_node._ofs());

    return new_node;
}